

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXExportNode.cpp
# Opt level: O1

void __thiscall
Assimp::FBX::Node::DumpProperties(Node *this,StreamWriterLE *s,bool binary,int indent)

{
  pointer pFVar1;
  undefined7 in_register_00000011;
  FBXExportProperty *p;
  pointer this_00;
  ostringstream ss;
  string local_1b8;
  ostringstream local_198 [112];
  ios_base local_128 [264];
  
  if ((int)CONCAT71(in_register_00000011,binary) == 0) {
    std::__cxx11::ostringstream::ostringstream(local_198);
    DumpPropertiesAscii(this,(ostream *)local_198,indent);
    std::__cxx11::stringbuf::str();
    StreamWriter<false,_false>::PutString(s,&local_1b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
      operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream(local_198);
    std::ios_base::~ios_base(local_128);
  }
  else {
    pFVar1 = (this->properties).
             super__Vector_base<Assimp::FBX::FBXExportProperty,_std::allocator<Assimp::FBX::FBXExportProperty>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (this_00 = (this->properties).
                   super__Vector_base<Assimp::FBX::FBXExportProperty,_std::allocator<Assimp::FBX::FBXExportProperty>_>
                   ._M_impl.super__Vector_impl_data._M_start; this_00 != pFVar1;
        this_00 = this_00 + 1) {
      FBXExportProperty::DumpBinary(this_00,s);
    }
  }
  return;
}

Assistant:

void FBX::Node::DumpProperties(
    Assimp::StreamWriterLE& s,
    bool binary, int indent
) {
    if (binary) {
        DumpPropertiesBinary(s);
    } else {
        std::ostringstream ss;
        DumpPropertiesAscii(ss, indent);
        s.PutString(ss.str());
    }
}